

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack-opts.cpp
# Opt level: O2

Index __thiscall
wasm::StackIROptimizer::getNumConsumedValues(StackIROptimizer *this,StackInst *inst)

{
  Index IVar1;
  AbstractChildIterator<wasm::ChildIterator> local_50;
  
  if (inst->op == Basic) {
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator(&local_50,inst->origin);
    IVar1 = (int)((ulong)((long)local_50.children.flexible.
                                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_50.children.flexible.
                               super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 3) +
            (int)local_50.children.usedFixed;
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_50.children.flexible.
                super__Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>);
  }
  else {
    IVar1 = (Index)(inst->op == IfBegin);
  }
  return IVar1;
}

Assistant:

Index StackIROptimizer::getNumConsumedValues(StackInst* inst) {
  if (isControlFlow(inst)) {
    // If consumes 1; that's it.
    if (inst->op == StackInst::IfBegin) {
      return 1;
    }
    return 0;
  }
  // Otherwise, for basic instructions, just count the expression children.
  return ChildIterator(inst->origin).children.size();
}